

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

bool __thiscall ON_OutlineFigure::NegateY(ON_OutlineFigure *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ON_OutlineFigurePoint *pOVar4;
  uint local_24;
  ON__UINT32 i;
  ON_OutlineFigurePoint *a;
  ON__UINT32 count;
  bool rc;
  ON_OutlineFigure *this_local;
  
  bVar1 = false;
  uVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this->m_points);
  pOVar4 = ON_SimpleArray<ON_OutlineFigurePoint>::Array(&this->m_points);
  for (local_24 = 0; local_24 < uVar3; local_24 = local_24 + 1) {
    bVar2 = Internal_NegateY(&pOVar4[local_24].m_point);
    if (bVar2) {
      bVar1 = true;
    }
  }
  if (bVar1 != false) {
    if (this->m_orientation == Clockwise) {
      this->m_orientation = CounterClockwise;
    }
    else if (this->m_orientation == CounterClockwise) {
      this->m_orientation = Clockwise;
    }
    bVar2 = ON_IsValid(this->m_area_estimate);
    if ((bVar2) && ((this->m_area_estimate != 0.0 || (NAN(this->m_area_estimate))))) {
      this->m_area_estimate = -this->m_area_estimate;
    }
  }
  return bVar1;
}

Assistant:

bool ON_OutlineFigure::NegateY()
{
  bool rc = false;
  const ON__UINT32 count = m_points.UnsignedCount();
  ON_OutlineFigurePoint* a = m_points.Array();
  for (ON__UINT32 i = 0; i < count; i++)
  {
    if ( ON_OutlineFigure::Internal_NegateY(a[i].m_point) )
      rc = true;
  }

  if (rc)
  {
    if (ON_OutlineFigure::Orientation::Clockwise == m_orientation)
      m_orientation = ON_OutlineFigure::Orientation::CounterClockwise;
    else if (ON_OutlineFigure::Orientation::CounterClockwise == m_orientation)
      m_orientation = ON_OutlineFigure::Orientation::Clockwise;

    if (ON_IsValid(m_area_estimate) && 0.0 != m_area_estimate)
      m_area_estimate = -m_area_estimate;
  }

  return rc;
}